

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O3

void __thiscall
TPZFileStream::WriteData<Fad<double>>(TPZFileStream *this,Fad<double> *p,int howMany)

{
  ostream *poVar1;
  ulong uVar2;
  
  if (0 < howMany) {
    uVar2 = (ulong)(uint)howMany;
    do {
      poVar1 = ::operator<<((ostream *)&this->fOut,p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      p = p + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void  TPZFileStream::WriteData(const T *p, int howMany){
        for(int c=0; c<howMany; c++) fOut << p[c] << std::endl;
#ifdef PZDEBUG
        if (fOut.bad()) {
            PZError << "TFileStream:Could not write to stream" << std::endl;
            DebugStop();
        }
#endif
    }